

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Print
          (TextGenerator *this,char *text,size_t size)

{
  ulong local_30;
  size_t i;
  size_t pos;
  size_t size_local;
  char *text_local;
  TextGenerator *this_local;
  
  i = 0;
  for (local_30 = 0; local_30 < size; local_30 = local_30 + 1) {
    if (text[local_30] == '\n') {
      Write(this,text + i,(local_30 - i) + 1);
      i = local_30 + 1;
      this->at_start_of_line_ = true;
    }
  }
  Write(this,text + i,size - i);
  return;
}

Assistant:

void Print(const char* text, size_t size) {
    size_t pos = 0;  // The number of bytes we've written so far.

    for (size_t i = 0; i < size; i++) {
      if (text[i] == '\n') {
        // Saw newline.  If there is more text, we may need to insert an indent
        // here.  So, write what we have so far, including the '\n'.
        Write(text + pos, i - pos + 1);
        pos = i + 1;

        // Setting this true will cause the next Write() to insert an indent
        // first.
        at_start_of_line_ = true;
      }
    }

    // Write the rest.
    Write(text + pos, size - pos);
  }